

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O0

SW_FT_Bool ft_conic_is_small_enough(SW_FT_Vector *base,SW_FT_Angle *angle_in,SW_FT_Angle *angle_out)

{
  uint uVar1;
  uint uVar2;
  SW_FT_Angle SVar3;
  SW_FT_Pos SVar4;
  SW_FT_Angle *in_RDX;
  SW_FT_Angle *in_RSI;
  long *in_RDI;
  SW_FT_Int close2;
  SW_FT_Int close1;
  SW_FT_Angle theta;
  SW_FT_Vector d2;
  SW_FT_Vector d1;
  undefined4 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 uVar6;
  
  uVar6 = false;
  if ((-2 < in_RDI[2] - in_RDI[4]) && (uVar6 = false, in_RDI[2] - in_RDI[4] < 2)) {
    in_stack_ffffffffffffffb6 = -2 < in_RDI[3] - in_RDI[5] && in_RDI[3] - in_RDI[5] < 2;
    uVar6 = in_stack_ffffffffffffffb6;
  }
  uVar1 = (uint)(byte)uVar6;
  uVar5 = false;
  if ((-2 < *in_RDI - in_RDI[2]) && (uVar5 = false, *in_RDI - in_RDI[2] < 2)) {
    in_stack_ffffffffffffffb4 = -2 < in_RDI[1] - in_RDI[3] && in_RDI[1] - in_RDI[3] < 2;
    uVar5 = in_stack_ffffffffffffffb4;
  }
  uVar2 = (uint)(byte)uVar5;
  if (uVar1 == 0) {
    if (uVar2 == 0) {
      SVar3 = SW_FT_Atan2((ulong)(byte)uVar6 << 0x20,
                          CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffffb6,
                                                  CONCAT15(uVar5,CONCAT14(in_stack_ffffffffffffffb4,
                                                                          in_stack_ffffffffffffffb0)
                                                          ))));
      *in_RSI = SVar3;
      SVar3 = SW_FT_Atan2(CONCAT44(uVar1,uVar2),
                          CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffffb6,
                                                  CONCAT15(uVar5,CONCAT14(in_stack_ffffffffffffffb4,
                                                                          in_stack_ffffffffffffffb0)
                                                          ))));
      *in_RDX = SVar3;
    }
    else {
      SVar3 = SW_FT_Atan2((ulong)CONCAT14(uVar6,uVar2),
                          CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffffb6,
                                                  CONCAT15(uVar5,CONCAT14(in_stack_ffffffffffffffb4,
                                                                          in_stack_ffffffffffffffb0)
                                                          ))));
      *in_RDX = SVar3;
      *in_RSI = SVar3;
    }
  }
  else if (uVar2 == 0) {
    SVar3 = SW_FT_Atan2((ulong)(byte)uVar6 << 0x20,
                        CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffffb6,
                                                CONCAT15(uVar5,CONCAT14(in_stack_ffffffffffffffb4,
                                                                        in_stack_ffffffffffffffb0)))
                                ));
    *in_RDX = SVar3;
    *in_RSI = SVar3;
  }
  SVar3 = SW_FT_Angle_Diff(*in_RSI,*in_RDX);
  SVar4 = ft_pos_abs(SVar3);
  return SVar4 < 0x1e0000;
}

Assistant:

static SW_FT_Bool ft_conic_is_small_enough(SW_FT_Vector* base,
                                           SW_FT_Angle*  angle_in,
                                           SW_FT_Angle*  angle_out)
{
    SW_FT_Vector d1, d2;
    SW_FT_Angle  theta;
    SW_FT_Int    close1, close2;

    d1.x = base[1].x - base[2].x;
    d1.y = base[1].y - base[2].y;
    d2.x = base[0].x - base[1].x;
    d2.y = base[0].y - base[1].y;

    close1 = SW_FT_IS_SMALL(d1.x) && SW_FT_IS_SMALL(d1.y);
    close2 = SW_FT_IS_SMALL(d2.x) && SW_FT_IS_SMALL(d2.y);

    if (close1) {
        if (close2) {
            /* basically a point;                      */
            /* do nothing to retain original direction */
        } else {
            *angle_in = *angle_out = SW_FT_Atan2(d2.x, d2.y);
        }
    } else /* !close1 */
    {
        if (close2) {
            *angle_in = *angle_out = SW_FT_Atan2(d1.x, d1.y);
        } else {
            *angle_in = SW_FT_Atan2(d1.x, d1.y);
            *angle_out = SW_FT_Atan2(d2.x, d2.y);
        }
    }

    theta = ft_pos_abs(SW_FT_Angle_Diff(*angle_in, *angle_out));

    return SW_FT_BOOL(theta < SW_FT_SMALL_CONIC_THRESHOLD);
}